

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_analysisEnvironment_setNewSymbolLocalBinding
          (sysbvm_context_t *context,sysbvm_tuple_t environment,sysbvm_tuple_t sourcePosition,
          sysbvm_tuple_t name,sysbvm_tuple_t type)

{
  sysbvm_tuple_t sVar1;
  size_t vectorIndex;
  sysbvm_tuple_t sVar2;
  
  sVar1 = sysbvm_environment_lookFunctionAnalysisEnvironmentRecursively(context,environment);
  if (sVar1 == 0) {
    sysbvm_error("A function analysis environment is required here.");
  }
  sVar2 = *(sysbvm_tuple_t *)(sVar1 + 0x88);
  vectorIndex = sysbvm_orderedCollection_getSize(*(sysbvm_tuple_t *)(sVar1 + 0xa8));
  sVar2 = sysbvm_symbolLocalBinding_create(context,sourcePosition,name,type,sVar2,vectorIndex);
  if (name != 0) {
    sysbvm_environment_setNewBinding(context,environment,sVar2);
  }
  sysbvm_orderedCollection_add(context,*(sysbvm_tuple_t *)(sVar1 + 0xa8),sVar2);
  return sVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_analysisEnvironment_setNewSymbolLocalBinding(sysbvm_context_t *context, sysbvm_tuple_t environment, sysbvm_tuple_t sourcePosition, sysbvm_tuple_t name, sysbvm_tuple_t type)
{
    sysbvm_tuple_t functionAnalysisEnvironment = sysbvm_environment_lookFunctionAnalysisEnvironmentRecursively(context, environment);
    if(!functionAnalysisEnvironment)
        sysbvm_error("A function analysis environment is required here.");

    sysbvm_functionAnalysisEnvironment_t *functionAnalysisEnvironmentObject = (sysbvm_functionAnalysisEnvironment_t*)functionAnalysisEnvironment;
    sysbvm_tuple_t binding = sysbvm_symbolLocalBinding_create(context, sourcePosition, name, type, functionAnalysisEnvironmentObject->functionDefinition, sysbvm_orderedCollection_getSize(functionAnalysisEnvironmentObject->localBindingList));
    if(name)
        sysbvm_environment_setNewBinding(context, environment, binding);
    sysbvm_orderedCollection_add(context, functionAnalysisEnvironmentObject->localBindingList, binding);
    return binding;
}